

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

char * sqlite3_create_filename(char *zDatabase,char *zJournal,char *zWal,int nParam,char **azParam)

{
  char *__s;
  uint uVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  undefined4 *puVar6;
  void *__dest;
  ulong uVar7;
  void *pvVar8;
  long lVar9;
  u64 n;
  char *__dest_00;
  ulong uVar10;
  
  sVar3 = strlen(zDatabase);
  sVar4 = strlen(zJournal);
  sVar5 = strlen(zWal);
  n = sVar5 + sVar4 + sVar3 + 10;
  uVar1 = nParam * 2;
  if (0 < nParam) {
    uVar7 = 1;
    if (1 < (int)uVar1) {
      uVar7 = (ulong)uVar1;
    }
    uVar10 = 0;
    do {
      sVar3 = strlen(azParam[uVar10]);
      n = n + sVar3 + 1;
      uVar10 = uVar10 + 1;
    } while (uVar7 != uVar10);
  }
  iVar2 = sqlite3_initialize();
  if (iVar2 == 0) {
    puVar6 = (undefined4 *)sqlite3Malloc(n);
  }
  else {
    puVar6 = (undefined4 *)0x0;
  }
  if (puVar6 == (undefined4 *)0x0) {
    __dest_00 = (char *)0x0;
  }
  else {
    *puVar6 = 0;
    __dest_00 = (char *)(puVar6 + 1);
    sVar3 = strlen(zDatabase);
    memcpy(__dest_00,zDatabase,sVar3 + 1);
    if (nParam < 1) {
      lVar9 = (long)puVar6 + sVar3 + 4;
    }
    else {
      uVar7 = 1;
      if (1 < (int)uVar1) {
        uVar7 = (ulong)uVar1;
      }
      uVar10 = 0;
      pvVar8 = (void *)((long)puVar6 + sVar3 + 5);
      do {
        __dest = pvVar8;
        __s = azParam[uVar10];
        sVar3 = strlen(__s);
        memcpy(__dest,__s,sVar3 + 1);
        uVar10 = uVar10 + 1;
        pvVar8 = (void *)((long)__dest + sVar3 + 1);
      } while (uVar7 != uVar10);
      lVar9 = (long)__dest + sVar3;
    }
    *(undefined1 *)(lVar9 + 1) = 0;
    sVar3 = strlen(zJournal);
    memcpy((void *)(lVar9 + 2),zJournal,sVar3 + 1);
    pvVar8 = (void *)(sVar3 + lVar9 + 3);
    sVar3 = strlen(zWal);
    memcpy(pvVar8,zWal,sVar3 + 1);
    *(undefined2 *)(sVar3 + 1 + (long)pvVar8) = 0;
  }
  return __dest_00;
}

Assistant:

SQLITE_API char *sqlite3_create_filename(
  const char *zDatabase,
  const char *zJournal,
  const char *zWal,
  int nParam,
  const char **azParam
){
  sqlite3_int64 nByte;
  int i;
  char *pResult, *p;
  nByte = strlen(zDatabase) + strlen(zJournal) + strlen(zWal) + 10;
  for(i=0; i<nParam*2; i++){
    nByte += strlen(azParam[i])+1;
  }
  pResult = p = sqlite3_malloc64( nByte );
  if( p==0 ) return 0;
  memset(p, 0, 4);
  p += 4;
  p = appendText(p, zDatabase);
  for(i=0; i<nParam*2; i++){
    p = appendText(p, azParam[i]);
  }
  *(p++) = 0;
  p = appendText(p, zJournal);
  p = appendText(p, zWal);
  *(p++) = 0;
  *(p++) = 0;
  assert( (sqlite3_int64)(p - pResult)==nByte );
  return pResult + 4;
}